

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseSet.h
# Opt level: O0

bool __thiscall SparseSet<0>::insert(SparseSet<0> *this,uint value)

{
  bool bVar1;
  uint in_ESI;
  SparseSet<0> *in_RDI;
  
  bVar1 = elem(in_RDI,in_ESI);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!elem(value)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/caballa[P]covenant/include/adt/SparseSet.h"
                  ,0x5a,"virtual bool SparseSet<>::insert(unsigned int) [U = 0]");
  }
  in_RDI->sparse[in_ESI] = in_RDI->members;
  in_RDI->dense[in_RDI->members] = in_ESI;
  in_RDI->members = in_RDI->members + 1;
  return true;
}

Assistant:

virtual bool insert(unsigned int value)
  {
    if( U&1 )
    {
      unsigned int old_dense = sparse[value];
      unsigned int lost_val = dense[members];
      
      sparse[value] = members;
      dense[members] = value;
      
      sparse[lost_val] = old_dense;
      dense[old_dense] = lost_val;
    } 
    else 
    {
      assert( !elem(value) );
      
      sparse[value] = members;
      dense[members] = value;
    }
    members++;
    return true;
  }